

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StepInterface.h
# Opt level: O1

shared_ptr<Calculator> __thiscall
gurkenlaeufer::detail::ScenarioContext::getFixture<Calculator>(ScenarioContext *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  long *plVar2;
  pointer psVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Calculator *pCVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  vector<std::shared_ptr<gurkenlaeufer::detail::IFixture>,std::allocator<std::shared_ptr<gurkenlaeufer::detail::IFixture>>>
  *in_RSI;
  shared_ptr<gurkenlaeufer::detail::IFixture> *fixture_1;
  long *plVar5;
  undefined1 auVar6 [16];
  shared_ptr<Calculator> sVar7;
  shared_ptr<gurkenlaeufer::detail::Fixture<Calculator>_> fixture;
  shared_ptr<gurkenlaeufer::detail::Fixture<Calculator>_> local_48;
  vector<std::shared_ptr<gurkenlaeufer::detail::IFixture>,std::allocator<std::shared_ptr<gurkenlaeufer::detail::IFixture>>>
  *local_38;
  
  plVar5 = *(long **)in_RSI;
  plVar2 = *(long **)(in_RSI + 8);
  local_38 = in_RSI;
  do {
    if (plVar5 == plVar2) {
LAB_00153e84:
      local_48.
      super___shared_ptr<gurkenlaeufer::detail::Fixture<Calculator>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      local_48.
      super___shared_ptr<gurkenlaeufer::detail::Fixture<Calculator>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
      &(local_48.
        super___shared_ptr<gurkenlaeufer::detail::Fixture<Calculator>,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi)->_M_use_count)->_M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x100000001;
      ((__shared_ptr<gurkenlaeufer::detail::IFixture,_(__gnu_cxx::_Lock_policy)2> *)
      &(local_48.
        super___shared_ptr<gurkenlaeufer::detail::Fixture<Calculator>,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi)->_vptr__Sp_counted_base)->_M_ptr =
           (element_type *)&PTR___Sp_counted_ptr_inplace_00197f78;
      local_48.
      super___shared_ptr<gurkenlaeufer::detail::Fixture<Calculator>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)
               (local_48.
                super___shared_ptr<gurkenlaeufer::detail::Fixture<Calculator>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi + 1);
      ((__shared_ptr<gurkenlaeufer::detail::IFixture,_(__gnu_cxx::_Lock_policy)2> *)
      &local_48.
       super___shared_ptr<gurkenlaeufer::detail::Fixture<Calculator>,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi[1]._vptr__Sp_counted_base)->_M_ptr = (element_type *)0x0;
      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
      &local_48.
       super___shared_ptr<gurkenlaeufer::detail::Fixture<Calculator>,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi[1]._M_use_count)->_M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      ((__shared_ptr<gurkenlaeufer::detail::IFixture,_(__gnu_cxx::_Lock_policy)2> *)
      &local_48.
       super___shared_ptr<gurkenlaeufer::detail::Fixture<Calculator>,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi[2]._vptr__Sp_counted_base)->_M_ptr = (element_type *)0x0;
      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
      &local_48.
       super___shared_ptr<gurkenlaeufer::detail::Fixture<Calculator>,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi[2]._M_use_count)->_M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      ((__shared_ptr<gurkenlaeufer::detail::IFixture,_(__gnu_cxx::_Lock_policy)2> *)
      &local_48.
       super___shared_ptr<gurkenlaeufer::detail::Fixture<Calculator>,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi[1]._vptr__Sp_counted_base)->_M_ptr = (element_type *)&PTR__Fixture_00197fc8
      ;
      std::
      vector<std::shared_ptr<gurkenlaeufer::detail::IFixture>,std::allocator<std::shared_ptr<gurkenlaeufer::detail::IFixture>>>
      ::emplace_back<std::shared_ptr<gurkenlaeufer::detail::Fixture<Calculator>>&>
                (local_38,&local_48);
      pCVar4 = &(local_48.
                 super___shared_ptr<gurkenlaeufer::detail::Fixture<Calculator>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->super_Calculator;
      if (local_48.
          super___shared_ptr<gurkenlaeufer::detail::Fixture<Calculator>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr == (element_type *)0x0) {
        pCVar4 = (Calculator *)0x0;
      }
      (this->_fixtures).
      super__Vector_base<std::shared_ptr<gurkenlaeufer::detail::IFixture>,_std::allocator<std::shared_ptr<gurkenlaeufer::detail::IFixture>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)pCVar4;
      (this->_fixtures).
      super__Vector_base<std::shared_ptr<gurkenlaeufer::detail::IFixture>,_std::allocator<std::shared_ptr<gurkenlaeufer::detail::IFixture>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (this->_fixtures).
      super__Vector_base<std::shared_ptr<gurkenlaeufer::detail::IFixture>,_std::allocator<std::shared_ptr<gurkenlaeufer::detail::IFixture>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)local_48.
                    super___shared_ptr<gurkenlaeufer::detail::Fixture<Calculator>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
      in_RDX._M_pi = extraout_RDX_00;
LAB_00153f04:
      sVar7.super___shared_ptr<Calculator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           in_RDX._M_pi;
      sVar7.super___shared_ptr<Calculator,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
      ;
      return (shared_ptr<Calculator>)
             sVar7.super___shared_ptr<Calculator,_(__gnu_cxx::_Lock_policy)2>;
    }
    if (*plVar5 == 0) {
      auVar6._8_8_ = 0;
      auVar6._0_8_ = in_RDX._M_pi;
      auVar6 = auVar6 << 0x40;
    }
    else {
      auVar6 = __dynamic_cast(*plVar5,&IFixture::typeinfo,&Calculator::typeinfo,0xfffffffffffffffe);
    }
    in_RDX._M_pi = auVar6._8_8_;
    if (auVar6._0_8_ == (pointer)0x0) {
      (this->_fixtures).
      super__Vector_base<std::shared_ptr<gurkenlaeufer::detail::IFixture>,_std::allocator<std::shared_ptr<gurkenlaeufer::detail::IFixture>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (this->_fixtures).
      super__Vector_base<std::shared_ptr<gurkenlaeufer::detail::IFixture>,_std::allocator<std::shared_ptr<gurkenlaeufer::detail::IFixture>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    }
    else {
      (this->_fixtures).
      super__Vector_base<std::shared_ptr<gurkenlaeufer::detail::IFixture>,_std::allocator<std::shared_ptr<gurkenlaeufer::detail::IFixture>_>_>
      ._M_impl.super__Vector_impl_data._M_start = auVar6._0_8_;
      psVar3 = (pointer)plVar5[1];
      (this->_fixtures).
      super__Vector_base<std::shared_ptr<gurkenlaeufer::detail::IFixture>,_std::allocator<std::shared_ptr<gurkenlaeufer::detail::IFixture>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = psVar3;
      if (psVar3 != (pointer)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1 = &(psVar3->
                    super___shared_ptr<gurkenlaeufer::detail::IFixture,_(__gnu_cxx::_Lock_policy)2>)
                    ._M_refcount;
          *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
          UNLOCK();
        }
        else {
          p_Var1 = &(psVar3->
                    super___shared_ptr<gurkenlaeufer::detail::IFixture,_(__gnu_cxx::_Lock_policy)2>)
                    ._M_refcount;
          *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
        }
      }
    }
    if ((this->_fixtures).
        super__Vector_base<std::shared_ptr<gurkenlaeufer::detail::IFixture>,_std::allocator<std::shared_ptr<gurkenlaeufer::detail::IFixture>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      if (plVar5 != plVar2) goto LAB_00153f04;
      goto LAB_00153e84;
    }
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              (this->_fixtures).
              super__Vector_base<std::shared_ptr<gurkenlaeufer::detail::IFixture>,_std::allocator<std::shared_ptr<gurkenlaeufer::detail::IFixture>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      in_RDX._M_pi = extraout_RDX;
    }
    plVar5 = plVar5 + 2;
  } while( true );
}

Assistant:

std::shared_ptr<T> getFixture()
        {
            for (auto& fixture : _fixtures) {
                auto ptr = std::dynamic_pointer_cast<T>(fixture);
                if (ptr != nullptr) {
                    return ptr;
                }
            }

            auto fixture = std::make_shared<Fixture<T>>();
            _fixtures.emplace_back(fixture);
            return fixture;
        }